

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.hh
# Opt level: O2

void __thiscall SSM::DeviceException::DeviceException(DeviceException *this,string *msg)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)msg);
  Exception::Exception(&this->super_Exception,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00109d08;
  return;
}

Assistant:

DeviceException(std::string msg) : Exception(msg) {}